

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O2

void __thiscall
SuiteTimeRangeTests::TestisInRangeWithDay_PastSundayOverlapSession::RunImpl
          (TestisInRangeWithDay_PastSundayOverlapSession *this)

{
  TestResults *pTVar1;
  bool bVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_f8;
  UtcTimeStamp creation;
  UtcTimeOnly endTime;
  UtcTimeOnly startTime;
  UtcTimeStamp expPrevSession;
  UtcTimeStamp expNextSession;
  UtcTimeStamp expSameSession2;
  UtcTimeStamp expSameSession1;
  
  FIX::UtcTimeOnly::UtcTimeOnly(&startTime,0,0,0,0);
  FIX::UtcTimeOnly::UtcTimeOnly(&endTime,0x17,0x3b,0x3b,0);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&creation.super_DateTime,0,0,1,0x17,4,0x7e5);
  FIX::UtcTimeStamp::UtcTimeStamp
            ((UtcTimeStamp *)&expSameSession1.super_DateTime,8,0x1e,0,0x18,4,0x7e5);
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,6,5,&creation.super_DateTime,
                     &expSameSession1.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_f8,*ppTVar4,0xa3);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_f8,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expSameSession1)"
              );
  }
  FIX::UtcTimeStamp::UtcTimeStamp
            ((UtcTimeStamp *)&expSameSession2.super_DateTime,8,0x1e,0,0x1a,4,0x7e5);
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,6,5,&creation.super_DateTime,
                     &expSameSession2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_f8,*ppTVar4,0xa7);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_f8,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expSameSession2)"
              );
  }
  FIX::UtcTimeStamp::UtcTimeStamp
            ((UtcTimeStamp *)&expNextSession.super_DateTime,8,0x1e,0,0x1e,4,0x7e5);
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,6,5,&creation.super_DateTime,&expNextSession.super_DateTime
                    );
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_f8,*ppTVar4,0xab);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_f8,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expNextSession)"
              );
  }
  FIX::UtcTimeStamp::UtcTimeStamp
            ((UtcTimeStamp *)&expPrevSession.super_DateTime,0x17,0x3b,0x3a,0x16,4,0x7e5);
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,6,5,&creation.super_DateTime,&expPrevSession.super_DateTime
                    );
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_f8,*ppTVar4,0xaf);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_f8,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expPrevSession)"
              );
  }
  return;
}

Assistant:

TEST(isInRangeWithDay_PastSundayOverlapSession)
{
    //Start Friday 00:00:00, end Thursday 23:59:59
    UtcTimeOnly startTime( 0, 0, 0 );
    UtcTimeOnly endTime( 23, 59, 59 );
    int startDay = 6;
    int endDay = 5;

    //Given creation happened on a Friday at 00:00:01, and a login the next day Saturday
    UtcTimeStamp creation( 0, 0, 1, 23, 4, 2021 );
    UtcTimeStamp expSameSession1( 8, 30, 0, 24, 4, 2021 );
    CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expSameSession1) );

    //Then a login request on a Monday at 08:30:00 should be part of the same session
    UtcTimeStamp expSameSession2( 8, 30, 0, 26, 4, 2021 );
    CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expSameSession2) );

    //But a login request on the following Friday at 08:30:00 should be part of a different session
    UtcTimeStamp expNextSession( 8, 30, 0, 30, 4, 2021 );
    CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expNextSession) );

    //And a login request on the preceding Thursday at 23:59:58 should be part of a different session
    UtcTimeStamp expPrevSession( 23, 59, 58, 22, 4, 2021 );
    CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expPrevSession) );
}